

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

char * point_basename(char *path)

{
  char *pcVar1;
  char firstbyte;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  
  pcVar3 = G_BACKSLASH_CHAR;
  pcVar2 = G_FORWARD_SLASH_CHAR;
  firstbyte = *path;
  pcVar5 = path;
  while (firstbyte != '\0') {
    sVar4 = GetUTF8Length(firstbyte);
    if (sVar4 < 2) {
      if ((firstbyte == *pcVar3) || (firstbyte == *pcVar2)) {
        pcVar5 = path + 1;
      }
    }
    else {
      path = path + (sVar4 - 1);
    }
    pcVar1 = path + 1;
    path = path + 1;
    firstbyte = *pcVar1;
  }
  return pcVar5;
}

Assistant:

char *point_basename(const char *path)
{
	const char *b = path;
	const char *p;
	for (p = b; *p; p++)
	{
		size_t step = GetUTF8Length(*p);
		if (step > 1)
		{
			p += step - 1;
			continue;
		}
		if ((*p == *G_BACKSLASH_CHAR) || (*p == *G_FORWARD_SLASH_CHAR))
		{
			b = p + 1;
		}
	}
	return (char *)b;
}